

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O0

_Bool ransac(Correspondence *matched_points,int npoints,TransformationType type,
            MotionModel *motion_models,int num_desired_motions,_Bool *mem_alloc_failed)

{
  _Bool _Var1;
  _Bool *in_stack_000000a0;
  RansacModelInfo *in_stack_000000a8;
  int in_stack_000000b4;
  MotionModel *in_stack_000000b8;
  int in_stack_000000c4;
  Correspondence *in_stack_000000c8;
  
  _Var1 = ransac_internal(in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b4,
                          in_stack_000000a8,in_stack_000000a0);
  return _Var1;
}

Assistant:

bool ransac(const Correspondence *matched_points, int npoints,
            TransformationType type, MotionModel *motion_models,
            int num_desired_motions, bool *mem_alloc_failed) {
#if ALLOW_TRANSLATION_MODELS
  assert(type > IDENTITY && type < TRANS_TYPES);
#else
  assert(type > TRANSLATION && type < TRANS_TYPES);
#endif  // ALLOW_TRANSLATION_MODELS

  return ransac_internal(matched_points, npoints, motion_models,
                         num_desired_motions, &ransac_model_info[type],
                         mem_alloc_failed);
}